

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O2

bool ImGui_ImplSDL2_Init(SDL_Window *window)

{
  undefined1 in_AL;
  int iVar1;
  long lVar2;
  char *__s1;
  
  g_Window = window;
  lVar2 = ImGui::GetIO();
  *(byte *)(lVar2 + 4) = *(byte *)(lVar2 + 4) | 6;
  *(char **)(lVar2 + 0xd0) = "imgui_impl_sdl";
  *(undefined8 *)(lVar2 + 0x34) = 0x500000002b;
  *(undefined8 *)(lVar2 + 0x3c) = 0x520000004f;
  *(undefined8 *)(lVar2 + 0x44) = 0x4b00000051;
  *(undefined8 *)(lVar2 + 0x4c) = 0x4a0000004e;
  *(undefined8 *)(lVar2 + 0x54) = 0x490000004d;
  *(undefined8 *)(lVar2 + 0x5c) = 0x2a0000004c;
  *(undefined8 *)(lVar2 + 100) = 0x280000002c;
  *(undefined8 *)(lVar2 + 0x6c) = 0x5800000029;
  *(undefined4 *)(lVar2 + 0x74) = 4;
  *(undefined4 *)(lVar2 + 0x78) = 6;
  *(undefined4 *)(lVar2 + 0x7c) = 0x19;
  *(undefined4 *)(lVar2 + 0x80) = 0x1b;
  *(undefined8 *)(lVar2 + 0x84) = 0x1d0000001c;
  *(code **)(lVar2 + 0x100) = ImGui_ImplSDL2_SetClipboardText;
  *(code **)(lVar2 + 0xf8) = ImGui_ImplSDL2_GetClipboardText;
  *(undefined8 *)(lVar2 + 0x108) = 0;
  g_MouseCursors[0] = (SDL_Cursor *)SDL_CreateSystemCursor(0);
  g_MouseCursors[1] = (SDL_Cursor *)SDL_CreateSystemCursor(1);
  g_MouseCursors[2] = (SDL_Cursor *)SDL_CreateSystemCursor(9);
  g_MouseCursors[3] = (SDL_Cursor *)SDL_CreateSystemCursor(8);
  g_MouseCursors[4] = (SDL_Cursor *)SDL_CreateSystemCursor(7);
  g_MouseCursors[5] = (SDL_Cursor *)SDL_CreateSystemCursor(6);
  g_MouseCursors[6] = (SDL_Cursor *)SDL_CreateSystemCursor(5);
  g_MouseCursors[7] = (SDL_Cursor *)SDL_CreateSystemCursor(0xb);
  g_MouseCursors[8] = (SDL_Cursor *)SDL_CreateSystemCursor(10);
  __s1 = (char *)SDL_GetCurrentVideoDriver();
  iVar1 = strncmp(__s1,"wayland",7);
  g_MouseCanUseGlobalState = iVar1 != 0;
  return (bool)in_AL;
}

Assistant:

static bool ImGui_ImplSDL2_Init(SDL_Window* window)
{
    g_Window = window;

    // Setup back-end capabilities flags
    ImGuiIO& io = ImGui::GetIO();
    io.BackendFlags |= ImGuiBackendFlags_HasMouseCursors;       // We can honor GetMouseCursor() values (optional)
    io.BackendFlags |= ImGuiBackendFlags_HasSetMousePos;        // We can honor io.WantSetMousePos requests (optional, rarely used)
    io.BackendPlatformName = "imgui_impl_sdl";

    // Keyboard mapping. ImGui will use those indices to peek into the io.KeysDown[] array.
    io.KeyMap[ImGuiKey_Tab] = SDL_SCANCODE_TAB;
    io.KeyMap[ImGuiKey_LeftArrow] = SDL_SCANCODE_LEFT;
    io.KeyMap[ImGuiKey_RightArrow] = SDL_SCANCODE_RIGHT;
    io.KeyMap[ImGuiKey_UpArrow] = SDL_SCANCODE_UP;
    io.KeyMap[ImGuiKey_DownArrow] = SDL_SCANCODE_DOWN;
    io.KeyMap[ImGuiKey_PageUp] = SDL_SCANCODE_PAGEUP;
    io.KeyMap[ImGuiKey_PageDown] = SDL_SCANCODE_PAGEDOWN;
    io.KeyMap[ImGuiKey_Home] = SDL_SCANCODE_HOME;
    io.KeyMap[ImGuiKey_End] = SDL_SCANCODE_END;
    io.KeyMap[ImGuiKey_Insert] = SDL_SCANCODE_INSERT;
    io.KeyMap[ImGuiKey_Delete] = SDL_SCANCODE_DELETE;
    io.KeyMap[ImGuiKey_Backspace] = SDL_SCANCODE_BACKSPACE;
    io.KeyMap[ImGuiKey_Space] = SDL_SCANCODE_SPACE;
    io.KeyMap[ImGuiKey_Enter] = SDL_SCANCODE_RETURN;
    io.KeyMap[ImGuiKey_Escape] = SDL_SCANCODE_ESCAPE;
    io.KeyMap[ImGuiKey_KeyPadEnter] = SDL_SCANCODE_KP_ENTER;
    io.KeyMap[ImGuiKey_A] = SDL_SCANCODE_A;
    io.KeyMap[ImGuiKey_C] = SDL_SCANCODE_C;
    io.KeyMap[ImGuiKey_V] = SDL_SCANCODE_V;
    io.KeyMap[ImGuiKey_X] = SDL_SCANCODE_X;
    io.KeyMap[ImGuiKey_Y] = SDL_SCANCODE_Y;
    io.KeyMap[ImGuiKey_Z] = SDL_SCANCODE_Z;

    io.SetClipboardTextFn = ImGui_ImplSDL2_SetClipboardText;
    io.GetClipboardTextFn = ImGui_ImplSDL2_GetClipboardText;
    io.ClipboardUserData = NULL;

    // Load mouse cursors
    g_MouseCursors[ImGuiMouseCursor_Arrow] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_ARROW);
    g_MouseCursors[ImGuiMouseCursor_TextInput] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_IBEAM);
    g_MouseCursors[ImGuiMouseCursor_ResizeAll] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZEALL);
    g_MouseCursors[ImGuiMouseCursor_ResizeNS] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZENS);
    g_MouseCursors[ImGuiMouseCursor_ResizeEW] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZEWE);
    g_MouseCursors[ImGuiMouseCursor_ResizeNESW] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZENESW);
    g_MouseCursors[ImGuiMouseCursor_ResizeNWSE] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_SIZENWSE);
    g_MouseCursors[ImGuiMouseCursor_Hand] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_HAND);
    g_MouseCursors[ImGuiMouseCursor_NotAllowed] = SDL_CreateSystemCursor(SDL_SYSTEM_CURSOR_NO);

    // Check and store if we are on Wayland
    g_MouseCanUseGlobalState = strncmp(SDL_GetCurrentVideoDriver(), "wayland", 7) != 0;

#ifdef _WIN32
    SDL_SysWMinfo wmInfo;
    SDL_VERSION(&wmInfo.version);
    SDL_GetWindowWMInfo(window, &wmInfo);
    io.ImeWindowHandle = wmInfo.info.win.window;
#else
    (void)window;
#endif

    return true;
}